

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O3

int CVmObjClass::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  
  iVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (iVar1 == 1) {
    s_getp_is_int_class(result,argc);
    return 1;
  }
  iVar1 = CVmObject::call_stat_prop(result,pc_ptr,argc,prop);
  return iVar1;
}

Assistant:

int CVmObjClass::call_stat_prop(VMG_ vm_val_t *result, const uchar **pc_ptr,
                                uint *argc, vm_prop_id_t prop)
{
    /* translate the property into a function vector index */
    switch(G_meta_table
           ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop))
    {
    case 1:
        /* isIntrinsicClass(x) */
        return s_getp_is_int_class(vmg_ result, argc);

    default:
        /* 
         *   we don't define this one - inherit the default from the base
         *   object metaclass 
         */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}